

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_cursor.cxx
# Opt level: O3

void __thiscall Fl_Window::cursor(Fl_Window *this,Fl_Cursor c)

{
  int iVar1;
  Fl_Window *pFVar2;
  Fl_Window *this_00;
  char **D;
  int hoty;
  bool bVar3;
  Fl_RGB_Image FStack_98;
  Fl_Pixmap local_58;
  
LAB_001e84d7:
  this_00 = this;
  pFVar2 = Fl_Widget::window((Fl_Widget *)this_00);
  if (pFVar2 != (Fl_Window *)0x0) {
    do {
      this = pFVar2;
      pFVar2 = Fl_Widget::window((Fl_Widget *)this);
    } while (pFVar2 != (Fl_Window *)0x0);
    if (this != this_00) goto LAB_001e84d7;
  }
  if (c == FL_CURSOR_DEFAULT) {
    c = this_00->cursor_default;
  }
  if (this_00->i == (Fl_X *)0x0) {
    return;
  }
  iVar1 = Fl_X::set_cursor(this_00->i,c);
  if (iVar1 != 0) {
    return;
  }
  this = this_00;
  if ((int)c < 0x50) {
    if (c == FL_CURSOR_ARROW) {
      return;
    }
    if (c == FL_CURSOR_HELP) {
      hoty = 3;
      iVar1 = 1;
      D = fl_cursor_help_xpm;
      goto LAB_001e85bc;
    }
    bVar3 = c == FL_CURSOR_WAIT;
    c = FL_CURSOR_ARROW;
    if (bVar3) {
      hoty = 9;
      iVar1 = 7;
      D = fl_cursor_wait_xpm;
      goto LAB_001e85bc;
    }
  }
  else {
    if (c == FL_CURSOR_NWSE) {
      D = fl_cursor_nwse_xpm;
LAB_001e85b6:
      iVar1 = 7;
      hoty = 7;
      goto LAB_001e85bc;
    }
    if (c == FL_CURSOR_NESW) {
      D = fl_cursor_nesw_xpm;
      goto LAB_001e85b6;
    }
    bVar3 = c == FL_CURSOR_NONE;
    c = FL_CURSOR_ARROW;
    if (bVar3) {
      iVar1 = 0;
      D = fl_cursor_none_xpm;
      hoty = 0;
LAB_001e85bc:
      Fl_Pixmap::Fl_Pixmap(&local_58,D);
      Fl_RGB_Image::Fl_RGB_Image(&FStack_98,&local_58,0x31);
      cursor(this_00,&FStack_98,iVar1,hoty);
      Fl_RGB_Image::~Fl_RGB_Image(&FStack_98);
      Fl_Pixmap::~Fl_Pixmap(&local_58);
      return;
    }
  }
  goto LAB_001e84d7;
}

Assistant:

void Fl_Window::cursor(Fl_Cursor c) {
  int ret;

  // the cursor must be set for the top level window, not for subwindows
  Fl_Window *w = window(), *toplevel = this;

  while (w) {
    toplevel = w;
    w = w->window();
  }

  if (toplevel != this) {
    toplevel->cursor(c);
    return;
  }

  if (c == FL_CURSOR_DEFAULT)
    c = cursor_default;

  if (!i)
    return;

  ret = i->set_cursor(c);
  if (ret)
    return;

  fallback_cursor(this, c);
}